

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_ps_static::load(xr_level_ps_static *this,xr_reader *r)

{
  pointer *ppppVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  iterator __position;
  uint16_t *puVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint16_t uVar13;
  size_t sVar14;
  uint id;
  particle_data *particle;
  particle_data *local_40;
  xr_reader *local_38;
  
  sVar14 = xr_reader::find_chunk(r,0);
  if (sVar14 == 4) {
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    uVar2 = *puVar3;
    this->m_version = uVar2;
    if (uVar2 != 1) {
      __assert_fail("m_version == PS_VERSION_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ps_static.cxx"
                    ,0x10,"void xray_re::xr_level_ps_static::load(xr_reader &)");
    }
  }
  else {
    this->m_version = 0;
  }
  id = (uint)(sVar14 == 4);
  local_38 = xr_reader::open_chunk(r,id);
  if (local_38 != (xr_reader *)0x0) {
    do {
      id = id + 1;
      local_40 = (particle_data *)operator_new(0x68);
      (local_40->reference)._M_dataplus._M_p = (pointer)&(local_40->reference).field_2;
      (local_40->reference)._M_string_length = 0;
      (local_40->reference).field_2._M_local_buf[0] = '\0';
      __position._M_current =
           (this->m_particles).
           super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_particles).
          super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<xray_re::particle_data*,std::allocator<xray_re::particle_data*>>::
        _M_realloc_insert<xray_re::particle_data*const&>
                  ((vector<xray_re::particle_data*,std::allocator<xray_re::particle_data*>> *)
                   &this->m_particles,__position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        ppppVar1 = &(this->m_particles).
                    super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *ppppVar1 = *ppppVar1 + 1;
      }
      if (this->m_version == 0) {
        uVar13 = 0xffff;
      }
      else {
        puVar4 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
        uVar13 = *puVar4;
      }
      local_40->extra = uVar13;
      xr_reader::r_sz(r,&local_40->reference);
      puVar5 = (r->field_2).m_p;
      uVar6 = *(undefined8 *)puVar5;
      uVar7 = *(undefined8 *)(puVar5 + 8);
      uVar8 = *(undefined8 *)(puVar5 + 0x10);
      uVar9 = *(undefined8 *)(puVar5 + 0x18);
      uVar10 = *(undefined8 *)(puVar5 + 0x20);
      uVar11 = *(undefined8 *)(puVar5 + 0x28);
      uVar12 = *(undefined8 *)(puVar5 + 0x38);
      *(undefined8 *)((long)&(local_40->xform).field_0 + 0x30) = *(undefined8 *)(puVar5 + 0x30);
      *(undefined8 *)((long)&(local_40->xform).field_0 + 0x38) = uVar12;
      *(undefined8 *)((long)&(local_40->xform).field_0 + 0x20) = uVar10;
      *(undefined8 *)((long)&(local_40->xform).field_0 + 0x28) = uVar11;
      *(undefined8 *)((long)&(local_40->xform).field_0 + 0x10) = uVar8;
      *(undefined8 *)((long)&(local_40->xform).field_0 + 0x18) = uVar9;
      *(undefined8 *)&(local_40->xform).field_0 = uVar6;
      *(undefined8 *)((long)&(local_40->xform).field_0 + 8) = uVar7;
      (r->field_2).m_p = (r->field_2).m_p + 0x40;
      xr_reader::close_chunk(r,&local_38);
      local_38 = xr_reader::open_chunk(r,id);
    } while (local_38 != (xr_reader *)0x0);
  }
  return;
}

Assistant:

void xr_level_ps_static::load(xr_reader& r)
{
	if (r.find_chunk(PS_CHUNK_VERSION) == sizeof(uint32_t)) {
		m_version = r.r_u32();
		xr_assert(m_version == PS_VERSION_1);
	} else {
		m_version = PS_VERSION_0;
	}
	// compiler will optimize this, so no explicit (id = version) trick.
	uint32_t id = (m_version == PS_VERSION_0) ? 0 : 1;
	for (xr_reader* s; (s = r.open_chunk(id)); ++id) {
		particle_data* particle = new particle_data;
		m_particles.push_back(particle);
		particle->extra = (m_version == PS_VERSION_0) ? 0xffff : r.r_u16();
		r.r_sz(particle->reference);
		r.r(particle->xform);
		r.close_chunk(s);
	}
}